

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int getPid(QString *package)

{
  Data *pDVar1;
  int *piVar2;
  Data *pDVar3;
  int iVar4;
  QString *data;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QByteArrayView QVar9;
  QAnyStringView QVar10;
  QArrayData *d;
  bool ok;
  QArrayDataPointer<QString> local_d8;
  QByteArray local_b8;
  QArrayDataPointer<QByteArray> local_98;
  QByteArray local_78;
  QArrayDataPointer<QByteArray> local_58;
  long local_40 [2];
  qsizetype qStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char *)0x0;
  local_b8.d.size = 0;
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QVar9.m_data = (storage_type *)0x5;
  QVar9.m_size = (qsizetype)&local_98;
  QString::fromLatin1(QVar9);
  local_58.d = local_98.d;
  local_58.ptr = local_98.ptr;
  local_58.size = local_98.size;
  local_98.ptr = (QByteArray *)(package->d).ptr;
  local_98.size = (package->d).size | 0x8000000000000000;
  local_98.d = (Data *)CONCAT71(local_98.d._1_7_,1);
  local_78.d.ptr = (char *)0x0;
  QVar10.m_size = (size_t)"ps | grep \' %1\'";
  QVar10.field_0.m_data = local_40;
  local_78.d.d = (Data *)&local_98;
  QtPrivate::argToQString(QVar10,0x400000000000000f,(ArgBase **)0x1);
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_98,0x18,0x10,2,KeepSize);
  local_d8.d = (Data *)local_98.d;
  local_d8.size = 0;
  uVar5 = 0xffffffffffffffe8;
  do {
    pDVar1 = *(Data **)((long)local_40 + uVar5);
    local_d8.ptr[local_d8.size].d.d = pDVar1;
    local_d8.ptr[local_d8.size].d.ptr = *(char16_t **)((long)local_40 + uVar5 + 8);
    local_d8.ptr[local_d8.size].d.size = *(qsizetype *)((long)local_40 + uVar5 + 0x10);
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d8.size = local_d8.size + 1;
    bVar8 = 0xffffffffffffffe7 < uVar5;
    uVar5 = uVar5 + 0x18;
  } while (bVar8);
  lVar7 = 0x18;
  do {
    piVar2 = *(int **)((long)&local_58.d + lVar7);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)&local_58.d + lVar7),2,0x10);
      }
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  iVar6 = 0;
  bVar8 = execAdbCommand((QStringList *)&local_d8,&local_b8,false);
  if (bVar8) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_58);
    if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
      iVar6 = 0;
    }
    else {
      local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::simplified_helper(&local_78);
      QByteArray::replace((char)&local_78,'\t');
      QByteArray::split((char)&local_98);
      pDVar3 = local_78.d.d;
      if ((QArrayDataPointer<QByteArray> *)local_78.d.d != (QArrayDataPointer<QByteArray> *)0x0) {
        LOCK();
        *(int *)&(local_78.d.d)->super_QArrayData = *(int *)&(local_78.d.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&pDVar3->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
        }
      }
      iVar6 = 0;
      if ((undefined1 *)0x2 < (ulong)local_98.size) {
        local_78.d.d = (Data *)((ulong)local_78.d.d & 0xffffffffffffff00);
        iVar4 = QByteArray::toInt((bool *)(local_98.ptr + 1),(int)&local_78);
        iVar6 = -1;
        if ((char)local_78.d.d != '\0') {
          iVar6 = iVar4;
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_58);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

static int getPid(const QString &package)
{
    QByteArray output;
    const QStringList psArgs = { "shell"_L1, "ps | grep ' %1'"_L1.arg(package) };
    if (!execAdbCommand(psArgs, &output, false))
        return false;

    const QList<QByteArray> lines = output.split(u'\n');
    if (lines.size() < 1)
        return false;

    QList<QByteArray> columns = lines.first().simplified().replace(u'\t', u' ').split(u' ');
    if (columns.size() < 3)
        return false;

    bool ok = false;
    int pid = columns.at(1).toInt(&ok);
    if (ok)
        return pid;

    return -1;
}